

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_ManUndoGates(Bac_Man_t *p)

{
  int iVar1;
  int local_14;
  int i;
  Bac_Man_t *p_local;
  
  if (p->pMioLib != (void *)0x0) {
    for (local_14 = 1; iVar1 = Abc_NamObjNumMax(p->pMods), local_14 < iVar1; local_14 = local_14 + 1
        ) {
      if (p->ppGraphs[local_14] != (void *)0x0) {
        Dec_GraphFree((Dec_Graph_t *)p->ppGraphs[local_14]);
      }
    }
    if (p->ppGraphs != (void **)0x0) {
      free(p->ppGraphs);
      p->ppGraphs = (void **)0x0;
    }
  }
  return;
}

Assistant:

void Bac_ManUndoGates( Bac_Man_t * p )
{
    int i;
    if ( p->pMioLib == NULL )
        return;
    for ( i = 1; i < Abc_NamObjNumMax(p->pMods); i++ )
        if ( p->ppGraphs[i] )
            Dec_GraphFree( (Dec_Graph_t *)p->ppGraphs[i] );
    ABC_FREE( p->ppGraphs );
}